

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O0

void __thiscall MppBufferService::~MppBufferService(MppBufferService *this)

{
  RK_U32 id_00;
  list_head *plVar1;
  int iVar2;
  MppBufferGroupImpl *p;
  list_head **local_40;
  MppBufferGroupImpl *n_1;
  MppBufferGroupImpl *pos_1;
  MppBufferGroupImpl *n;
  MppBufferGroupImpl *pos;
  int local_18;
  RK_U32 id;
  RK_S32 j;
  RK_S32 i;
  MppBufferService *this_local;
  
  this->finalizing = 1;
  if (this->misc_count != 0) {
    _mpp_log_l(4,"mpp_buffer","cleaning misc group\n","~MppBufferService");
    for (id = 0; (int)id < 2; id = id + 1) {
      for (local_18 = 0; local_18 < 5; local_18 = local_18 + 1) {
        id_00 = this->misc[(int)id][local_18];
        if (id_00 != 0) {
          p = get_group_by_id(this,id_00);
          put_group(this,"~MppBufferService",p);
          this->misc[(int)id][local_18] = 0;
        }
      }
    }
  }
  iVar2 = list_empty(&this->mListGroup);
  if (iVar2 == 0) {
    if ((mpp_buffer_debug & 0x20) != 0) {
      dump(this,"leaked group found");
    }
    _mpp_log_l(4,"mpp_buffer","cleaning leaked group\n","~MppBufferService");
    plVar1 = (this->mListGroup).next;
    n = (MppBufferGroupImpl *)&plVar1[-0x11].prev;
    plVar1 = plVar1->next;
    while (pos_1 = (MppBufferGroupImpl *)&plVar1[-0x11].prev, &n->list_group != &this->mListGroup) {
      put_group(this,"~MppBufferService",n);
      n = pos_1;
      plVar1 = plVar1->next;
    }
  }
  iVar2 = list_empty(&this->mListOrphan);
  if (iVar2 == 0) {
    _mpp_log_l(4,"mpp_buffer","cleaning leaked buffer\n","~MppBufferService");
    plVar1 = (this->mListOrphan).next;
    n_1 = (MppBufferGroupImpl *)&plVar1[-0x11].prev;
    plVar1 = plVar1->next;
    while (local_40 = &plVar1[-0x11].prev, &n_1->list_group != &this->mListOrphan) {
      n_1->clear_on_exit = 1;
      n_1->is_finalizing = 1;
      put_group(this,"~MppBufferService",n_1);
      n_1 = (MppBufferGroupImpl *)local_40;
      plVar1 = plVar1->next;
    }
  }
  this->finished = 1;
  for (id = 0; (int)id < 5; id = id + 1) {
    for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
      if (this->mAllocator[(int)id][local_18] != (MppAllocator)0x0) {
        mpp_allocator_put(this->mAllocator[(int)id] + local_18);
      }
    }
  }
  return;
}

Assistant:

MppBufferService::~MppBufferService()
{
    RK_S32 i, j;

    finalizing = 1;

    // first remove legacy group which is the normal case
    if (misc_count) {
        mpp_log_f("cleaning misc group\n");
        for (i = 0; i < MPP_BUFFER_MODE_BUTT; i++)
            for (j = 0; j < MPP_BUFFER_TYPE_BUTT; j++) {
                RK_U32 id = misc[i][j];

                if (id) {
                    put_group(__FUNCTION__, get_group_by_id(id));
                    misc[i][j] = 0;
                }
            }
    }

    // then remove the remaining group which is the leak one
    if (!list_empty(&mListGroup)) {
        MppBufferGroupImpl *pos, *n;

        if (mpp_buffer_debug & MPP_BUF_DBG_DUMP_ON_EXIT)
            dump("leaked group found");

        mpp_log_f("cleaning leaked group\n");
        list_for_each_entry_safe(pos, n, &mListGroup, MppBufferGroupImpl, list_group) {
            put_group(__FUNCTION__, pos);
        }
    }

    // remove all orphan buffer group
    if (!list_empty(&mListOrphan)) {
        MppBufferGroupImpl *pos, *n;

        mpp_log_f("cleaning leaked buffer\n");

        list_for_each_entry_safe(pos, n, &mListOrphan, MppBufferGroupImpl, list_group) {
            pos->clear_on_exit = 1;
            pos->is_finalizing = 1;
            put_group(__FUNCTION__, pos);
        }
    }
    finished = 1;

    for (i = 0; i < MPP_BUFFER_TYPE_BUTT; i++) {
        for (j = 0; j < MPP_ALLOCATOR_WITH_FLAG_NUM; j++) {
            if (mAllocator[i][j])
                mpp_allocator_put(&(mAllocator[i][j]));
        }
    }
}